

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

wchar_t get_base_item_tval(artifact_set_data *data)

{
  uint32_t uVar1;
  wchar_t local_14;
  wchar_t r;
  wchar_t tval;
  artifact_set_data *data_local;
  
  local_14 = L'\0';
  uVar1 = Rand_div(data->tv_freq[0x23]);
  for (; data->tv_freq[local_14] < (int)(uVar1 + 1); local_14 = local_14 + L'\x01') {
  }
  return local_14;
}

Assistant:

static int get_base_item_tval(struct artifact_set_data *data)
{
	int tval = 0;
	int r = randint1(data->tv_freq[TV_MAX - 1]);

	/* Get a tval based on original artifact tval frequencies */
	while (r > data->tv_freq[tval]) {
		tval++;
	}

	return tval;
}